

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int check_crl_time(X509_STORE_CTX *ctx,X509_CRL *crl,int notify)

{
  int iVar1;
  int iVar2;
  ASN1_TIME *pAVar3;
  int64_t iStack_30;
  int i;
  int64_t ptime;
  int notify_local;
  X509_CRL *crl_local;
  X509_STORE_CTX *ctx_local;
  
  if ((ctx->param->flags & 0x200000) != 0) {
    return 1;
  }
  if (notify != 0) {
    ctx->current_crl = crl;
  }
  if ((ctx->param->flags & 2) == 0) {
    iStack_30 = time((time_t *)0x0);
  }
  else {
    iStack_30 = ctx->param->check_time;
  }
  pAVar3 = X509_CRL_get0_lastUpdate(crl);
  iVar1 = X509_cmp_time_posix(pAVar3,iStack_30);
  if (iVar1 == 0) {
    if (notify == 0) {
      return 0;
    }
    ctx->error = 0xf;
    iVar2 = call_verify_cb(0,ctx);
    if (iVar2 == 0) {
      return 0;
    }
  }
  if (0 < iVar1) {
    if (notify == 0) {
      return 0;
    }
    ctx->error = 0xb;
    iVar1 = call_verify_cb(0,ctx);
    if (iVar1 == 0) {
      return 0;
    }
  }
  pAVar3 = X509_CRL_get0_nextUpdate(crl);
  if (pAVar3 != (ASN1_TIME *)0x0) {
    pAVar3 = X509_CRL_get0_nextUpdate(crl);
    iVar1 = X509_cmp_time_posix(pAVar3,iStack_30);
    if (iVar1 == 0) {
      if (notify == 0) {
        return 0;
      }
      ctx->error = 0x10;
      iVar2 = call_verify_cb(0,ctx);
      if (iVar2 == 0) {
        return 0;
      }
    }
    if (iVar1 < 0) {
      if (notify == 0) {
        return 0;
      }
      ctx->error = 0xc;
      iVar1 = call_verify_cb(0,ctx);
      if (iVar1 == 0) {
        return 0;
      }
    }
  }
  if (notify != 0) {
    ctx->current_crl = (X509_CRL *)0x0;
  }
  return 1;
}

Assistant:

static int check_crl_time(X509_STORE_CTX *ctx, X509_CRL *crl, int notify) {
  if (ctx->param->flags & X509_V_FLAG_NO_CHECK_TIME) {
    return 1;
  }

  if (notify) {
    ctx->current_crl = crl;
  }
  int64_t ptime;
  if (ctx->param->flags & X509_V_FLAG_USE_CHECK_TIME) {
    ptime = ctx->param->check_time;
  } else {
    ptime = time(NULL);
  }

  int i = X509_cmp_time_posix(X509_CRL_get0_lastUpdate(crl), ptime);
  if (i == 0) {
    if (!notify) {
      return 0;
    }
    ctx->error = X509_V_ERR_ERROR_IN_CRL_LAST_UPDATE_FIELD;
    if (!call_verify_cb(0, ctx)) {
      return 0;
    }
  }

  if (i > 0) {
    if (!notify) {
      return 0;
    }
    ctx->error = X509_V_ERR_CRL_NOT_YET_VALID;
    if (!call_verify_cb(0, ctx)) {
      return 0;
    }
  }

  if (X509_CRL_get0_nextUpdate(crl)) {
    i = X509_cmp_time_posix(X509_CRL_get0_nextUpdate(crl), ptime);

    if (i == 0) {
      if (!notify) {
        return 0;
      }
      ctx->error = X509_V_ERR_ERROR_IN_CRL_NEXT_UPDATE_FIELD;
      if (!call_verify_cb(0, ctx)) {
        return 0;
      }
    }
    if (i < 0) {
      if (!notify) {
        return 0;
      }
      ctx->error = X509_V_ERR_CRL_HAS_EXPIRED;
      if (!call_verify_cb(0, ctx)) {
        return 0;
      }
    }
  }

  if (notify) {
    ctx->current_crl = NULL;
  }

  return 1;
}